

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

BlockPointer __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::BlockPointer>
          (Deserializer *this,field_id_t field_id,char *tag,BlockPointer default_value)

{
  uint uVar1;
  undefined8 extraout_RDX;
  undefined6 in_register_00000032;
  type tVar3;
  BlockPointer BVar4;
  undefined8 uVar2;
  
  uVar2 = default_value._8_8_;
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  tVar3.offset = (int)extraout_RDX;
  tVar3.unused_padding = (int)((ulong)extraout_RDX >> 0x20);
  tVar3.block_id = default_value.block_id;
  if ((char)uVar1 != '\0') {
    tVar3 = Read<duckdb::BlockPointer>(this);
    uVar2 = tVar3._8_8_;
  }
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  BVar4.offset = (int)uVar2;
  BVar4.unused_padding = (int)((ulong)uVar2 >> 0x20);
  BVar4.block_id = tVar3.block_id;
  return BVar4;
}

Assistant:

inline T ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(default_value);
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}